

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

bool __thiscall
gtl::
dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
::resize_delta(dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
               *this,size_type delta)

{
  size_type sVar1;
  bool bVar2;
  size_type new_num_buckets;
  length_error *this_00;
  ulong uVar3;
  size_type sVar4;
  float fVar5;
  
  if ((this->settings).
      super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
      .consider_shrink_ == true) {
    bVar2 = maybe_shrink(this);
  }
  else {
    bVar2 = false;
  }
  if (this->num_elements < ~delta) {
    uVar3 = (this->settings).
            super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
            .enlarge_threshold_;
    if (uVar3 < this->num_buckets) {
      sVar4 = this->num_elements + delta;
      if (uVar3 < sVar4 || this->num_buckets < 4) {
        sVar4 = sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                ::min_buckets((sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                               *)this,sVar4,0);
        if (this->num_buckets < sVar4) {
          new_num_buckets =
               sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
               ::min_buckets((sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                              *)this,(this->num_elements + delta) - this->num_deleted,
                             this->num_buckets);
          if (new_num_buckets < sVar4) {
            sVar1 = new_num_buckets * 2;
            if ((long)sVar1 < 0) {
              fVar5 = (float)(new_num_buckets & 0x7fffffffffffffff) +
                      (float)(new_num_buckets & 0x7fffffffffffffff);
            }
            else {
              fVar5 = (float)(long)sVar1;
            }
            fVar5 = fVar5 * (this->settings).
                            super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                            .shrink_factor_;
            uVar3 = (ulong)fVar5;
            if (((long)(fVar5 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3) <=
                (delta + this->num_elements) - this->num_deleted) {
              new_num_buckets = sVar1;
            }
          }
          rebucket(this,new_num_buckets);
          bVar2 = true;
        }
      }
      return bVar2;
    }
    __assert_fail("settings.enlarge_threshold() < bucket_count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x27d,
                  "bool gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::resize_delta(size_type) [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>]"
                 );
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"resize overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

bool resize_delta(size_type delta) {
    bool did_resize = false;
    if (settings.consider_shrink()) {  // see if lots of deletes happened
      if (maybe_shrink())
        did_resize = true;
    }
    if (num_elements >= std::numeric_limits<size_type>::max() - delta) {
      throw std::length_error("resize overflow");
    }

    assert(settings.enlarge_threshold() < bucket_count());
    // Check if our work is done.
    if (bucket_count() >= HT_MIN_BUCKETS &&
        num_elements + delta <= settings.enlarge_threshold()) {
      return did_resize;
    }

    // Sometimes, we need to resize just to get rid of all the
    // "deleted" buckets that are clogging up the hashtable.  So when
    // deciding whether to resize, count the deleted buckets (which
    // are currently taking up room).  But later, when we decide what
    // size to resize to, *don't* count deleted buckets, since they
    // get discarded during the resize.
    const size_type needed_size = settings.min_buckets(num_elements + delta, 0);
    if (needed_size <= bucket_count())      // we have enough buckets
      return did_resize;

    // We will rebucket.
    size_type resize_to =
      settings.min_buckets(num_elements - num_deleted + delta, bucket_count());

    if (resize_to < needed_size) {
      // This situation means that we have enough deleted elements,
      // that once we purge them, we won't actually have needed to
      // grow.  But we may want to grow anyway: if we just purge one
      // element, say, we'll have to grow anyway next time we
      // insert.  Might as well grow now, since we're already going
      // through the trouble of rebucketing in order to purge the
      // deleted elements.  (Safety note: Can resize_to * 2 overflow? No.
      // The output of min_buckets() is always a power of two, so resize_to
      // and needed_size are powers of two. That plus resize_to < needed_size
      // proves that overflow isn't a concern.)
      const size_type target =
          static_cast<size_type>(settings.shrink_size(resize_to*2));
      if (num_elements - num_deleted + delta >= target) {
        // Good, we won't be below the shrink threshhold even if we double.
        resize_to *= 2;
      }
    }
    rebucket(resize_to);
    return true;
  }